

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialRuntimeObjects.cpp
# Opt level: O3

void __thiscall Lodtalk::SpecialRuntimeObjects::createSpecialClassTable(SpecialRuntimeObjects *this)

{
  Class *pCVar1;
  Metaclass *pMVar2;
  MemoryManager *this_00;
  ClassTable *this_01;
  pointer ppCVar3;
  long lVar4;
  ulong uVar5;
  size_t index;
  
  std::vector<Lodtalk::ClassDescription_*,_std::allocator<Lodtalk::ClassDescription_*>_>::resize
            (&this->specialClassTable,0x72);
  lVar4 = 1;
  do {
    pCVar1 = Class::basicNativeNewClass(this->context,(uint)lVar4);
    (this->specialClassTable).
    super__Vector_base<Lodtalk::ClassDescription_*,_std::allocator<Lodtalk::ClassDescription_*>_>.
    _M_impl.super__Vector_impl_data._M_start[lVar4 + -1] = &pCVar1->super_ClassDescription;
    pMVar2 = Metaclass::basicNativeNewMetaclass(this->context);
    (this->specialClassTable).
    super__Vector_base<Lodtalk::ClassDescription_*,_std::allocator<Lodtalk::ClassDescription_*>_>.
    _M_impl.super__Vector_impl_data._M_start[lVar4] = &pMVar2->super_ClassDescription;
    uVar5 = lVar4 - 1;
    lVar4 = lVar4 + 2;
  } while (uVar5 < 0x70);
  this_00 = VMContext::getMemoryManager(this->context);
  this_01 = MemoryManager::getClassTable(this_00);
  ppCVar3 = (this->specialClassTable).
            super__Vector_base<Lodtalk::ClassDescription_*,_std::allocator<Lodtalk::ClassDescription_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->specialClassTable).
      super__Vector_base<Lodtalk::ClassDescription_*,_std::allocator<Lodtalk::ClassDescription_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppCVar3) {
    index = 0;
    do {
      ClassTable::addSpecialClass(this_01,ppCVar3[index],index);
      index = index + 1;
      ppCVar3 = (this->specialClassTable).
                super__Vector_base<Lodtalk::ClassDescription_*,_std::allocator<Lodtalk::ClassDescription_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (index < (ulong)((long)(this->specialClassTable).
                                   super__Vector_base<Lodtalk::ClassDescription_*,_std::allocator<Lodtalk::ClassDescription_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar3 >> 3))
    ;
  }
  return;
}

Assistant:

void SpecialRuntimeObjects::createSpecialClassTable()
{
    specialClassTable.resize(SpecialClassTableSize);
    for(size_t i = 0; i < SpecialClassTableSize; i += 2)
    {
        specialClassTable[i] = Class::basicNativeNewClass(context, (unsigned int) (i + 1));
        specialClassTable[i + 1] = Metaclass::basicNativeNewMetaclass(context);
    }

    // Register the special classes in the class table.
    auto classTable = context->getMemoryManager()->getClassTable();
    for(size_t i = 0; i < specialClassTable.size(); ++i)
        classTable->addSpecialClass(specialClassTable[i], i);
}